

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.hpp
# Opt level: O2

void __thiscall
helics::apps::PhasorGenerator::PhasorGenerator(PhasorGenerator *this,string_view name)

{
  SignalGenerator::SignalGenerator(&this->super_SignalGenerator,name);
  (this->super_SignalGenerator)._vptr_SignalGenerator = (_func_int **)&PTR__SignalGenerator_004bdee8
  ;
  this->bias_real = 0.0;
  this->bias_imag = 0.0;
  this->frequency = 0.0;
  this->offset = 0.0;
  this->dfdt = 0.0;
  this->amplitude = 0.0;
  this->dAdt = 0.0;
  *(undefined8 *)(this->state)._M_value = 0x3ff0000000000000;
  *(undefined8 *)((this->state)._M_value + 8) = 0;
  *(undefined8 *)(this->rotation)._M_value = 0x3ff0000000000000;
  *(undefined8 *)((this->rotation)._M_value + 8) = 0;
  return;
}

Assistant:

explicit PhasorGenerator(std::string_view name): SignalGenerator(name) {}